

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPack.c
# Opt level: O0

void Aig_ManPackFree(Aig_ManPack_t *p)

{
  int iVar1;
  int iVar2;
  Aig_ManPack_t *p_local;
  
  printf("Patterns: ");
  printf("Total = %6d. ",(ulong)(uint)p->nPatTotal);
  printf("Skipped = %6d. ",(ulong)(uint)p->nPatSkip);
  iVar1 = Aig_ManPackCountCares(p);
  iVar2 = Aig_ManCiNum(p->pAig);
  printf("Cares = %6.2f %%  ",(((double)iVar1 * 100.0) / (double)iVar2) / 64.0);
  printf("\n");
  Vec_WrdFree(p->vSigns);
  Vec_WrdFree(p->vPiPats);
  Vec_WrdFree(p->vPiCare);
  if (p != (Aig_ManPack_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Aig_ManPackFree( Aig_ManPack_t * p )
{
//    Aig_ManPackPrintCare( p );
    printf( "Patterns: " );
    printf( "Total = %6d. ",   p->nPatTotal );
    printf( "Skipped = %6d. ", p->nPatSkip );
    printf( "Cares = %6.2f %%  ", 100.0*Aig_ManPackCountCares(p)/Aig_ManCiNum(p->pAig)/64 );
    printf( "\n" );
    Vec_WrdFree( p->vSigns );
    Vec_WrdFree( p->vPiPats );
    Vec_WrdFree( p->vPiCare );
    ABC_FREE( p );
}